

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O3

int intglobal(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  addressrec aVar5;
  symboltype sVar6;
  uint uVar7;
  addressrec *paVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  
  uVar9 = (ulong)(uint)numcodes;
  if (0 < numcodes) {
    piVar15 = &intcode[1].op3.opnd;
    lVar16 = 0;
    do {
      if (intcode[lVar16].opcode == opassn) {
        sVar6 = symclass(intcode[lVar16].op1.opnd);
        uVar9 = (ulong)(uint)numcodes;
        if (sVar6 == sttempvar && lVar16 + 1 < (long)numcodes) {
          uVar7 = numcodes - 1;
          cVar10 = '\0';
          lVar14 = lVar16;
          piVar13 = piVar15;
          do {
            if ((7 < (uint)piVar13[-6]) || (cVar10 != '\0')) {
              uVar7 = (uint)lVar14;
              break;
            }
            iVar12 = intcode[lVar16].op1.opnd;
            cVar10 = '\x01';
            if (iVar12 != piVar13[-2]) {
              cVar10 = (iVar12 == *piVar13) * '\x02';
            }
            lVar14 = lVar14 + 1;
            piVar13 = piVar13 + 7;
          } while (uVar9 - 1 != lVar14);
          if (cVar10 == '\x01') {
            paVar8 = &intcode[uVar7].op2;
          }
          else {
            if (cVar10 != '\x02') goto LAB_00108496;
            paVar8 = &intcode[uVar7].op3;
          }
          *paVar8 = intcode[lVar16].op2;
          intcode[lVar16].opcode = opnull;
        }
      }
LAB_00108496:
      lVar16 = lVar16 + 1;
      piVar15 = piVar15 + 7;
    } while (lVar16 < (int)uVar9);
    if (0 < (int)uVar9) {
      piVar15 = &intcode[1].op3.opnd;
      iVar12 = 2;
      lVar16 = 0;
      do {
        if (intcode[lVar16].opcode == opassn) {
          sVar6 = symclass(intcode[lVar16].op1.opnd);
          uVar9 = (ulong)(uint)numcodes;
          if (sVar6 == sttempvar) {
            if (lVar16 + 1 < (long)numcodes) {
              iVar1 = intcode[lVar16].op1.opnd;
              piVar13 = piVar15;
              iVar11 = iVar12;
              do {
                if ((piVar13[-4] == iVar1) || (piVar13[-2] == iVar1)) goto LAB_00108527;
                iVar2 = *piVar13;
                if (numcodes <= iVar11) break;
                piVar13 = piVar13 + 7;
                iVar11 = iVar11 + 1;
              } while (iVar2 != iVar1);
              if (iVar2 == iVar1) goto LAB_00108527;
            }
            intcode[lVar16].opcode = opnull;
          }
        }
LAB_00108527:
        lVar16 = lVar16 + 1;
        piVar15 = piVar15 + 7;
        iVar12 = iVar12 + 1;
      } while (lVar16 < (int)uVar9);
      if (0 < (int)uVar9) {
        lVar16 = 0;
        numcodes = 0;
        do {
          if (*(int *)((long)&intcode[0].opcode + lVar16) != 0) {
            uVar3 = *(undefined8 *)((long)&intcode[0].opcode + lVar16);
            uVar4 = *(undefined8 *)((long)&intcode[0].op1.opnd + lVar16);
            aVar5 = *(addressrec *)((long)&intcode[0].op3.opndtype + lVar16);
            intcode[numcodes].op2 = *(addressrec *)((long)&intcode[0].op2.opndtype + lVar16);
            intcode[numcodes].op3 = aVar5;
            intcode[numcodes].opcode = (int)uVar3;
            intcode[numcodes].op1.opndtype = (int)((ulong)uVar3 >> 0x20);
            *(undefined8 *)&intcode[numcodes].op1.opnd = uVar4;
            numcodes = numcodes + 1;
          }
          lVar16 = lVar16 + 0x1c;
        } while (uVar9 * 0x1c != lVar16);
        return numcodes;
      }
    }
  }
  numcodes = 0;
  return 0;
}

Assistant:

int	intglobal(void)
{
    int	i, j, tempused, tempcopied;
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempcopied = 0;
            for (j = i + 1;  j < numcodes && insamebb(j)
                 && !tempcopied;  j++)
                tempcopied = copyprop(i, j);
            if (tempcopied == 1)	{
                intcode[j-1].op2 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
            else if (tempcopied == 2)	{
                intcode[j-1].op3 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
        }
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempused = 0;
            for (j = i + 1;  j < numcodes && !tempused;  j++)
                tempused = codeappears(i, j);
            if (!tempused)
                intcode[i].opcode = opnull;
        }
    packcode();
    
    return(numcodes);
}